

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Reader * __thiscall capnp::DynamicValue::Reader::operator=(Reader *this,Reader *other)

{
  SegmentReader *pSVar1;
  SegmentReader *pSVar2;
  size_t sVar3;
  undefined4 uVar4;
  long lVar5;
  Reader *pRVar6;
  byte bVar7;
  
  bVar7 = 0;
  if ((this->type == CAPABILITY) &&
     (pSVar1 = (this->field_1).structValue.reader.segment, pSVar1 != (SegmentReader *)0x0)) {
    (this->field_1).textValue.super_StringPtr.content.size_ = 0;
    pSVar2 = (this->field_1).anyPointerValue.reader.segment;
    (*(code *)pSVar2->arena->_vptr_Arena)
              (pSVar2,(long)&pSVar1->arena + (long)pSVar1->arena[-2]._vptr_Arena);
  }
  if (other->type == CAPABILITY) {
    this->type = CAPABILITY;
    sVar3 = (other->field_1).textValue.super_StringPtr.content.size_;
    (this->field_1).intValue = (other->field_1).intValue;
    (this->field_1).textValue.super_StringPtr.content.size_ = sVar3;
    (other->field_1).textValue.super_StringPtr.content.size_ = 0;
    (this->field_1).listValue.reader.segment = (other->field_1).listValue.reader.segment;
  }
  else {
    pRVar6 = this;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      uVar4 = *(undefined4 *)&other->field_0x4;
      pRVar6->type = other->type;
      *(undefined4 *)&pRVar6->field_0x4 = uVar4;
      other = (Reader *)((long)other + (ulong)bVar7 * -0x10 + 8);
      pRVar6 = (Reader *)((long)pRVar6 + (ulong)bVar7 * -0x10 + 8);
    }
  }
  return this;
}

Assistant:

DynamicValue::Reader& DynamicValue::Reader::operator=(Reader&& other) {
  if (type == CAPABILITY) {
    kj::dtor(capabilityValue);
  }
  kj::ctor(*this, kj::mv(other));
  return *this;
}